

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O1

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::GetIssuanceBlindingKeyRequest,cfd::js::api::json::BlindingKeyResponse,cfd::js::api::GetIssuanceBlindingKeyRequestStruct,cfd::js::api::BlindingKeyResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::BlindingKeyResponseStruct_(const_cfd::js::api::GetIssuanceBlindingKeyRequestStruct_&)>
          *call_function)

{
  json *pjVar1;
  undefined8 uVar2;
  BlindingKeyResponseStruct response;
  BlindingKeyResponse res;
  GetIssuanceBlindingKeyRequestStruct request;
  GetIssuanceBlindingKeyRequest req;
  string local_2b8;
  BlindingKeyResponseStruct local_298;
  ErrorResponse local_1d0;
  GetIssuanceBlindingKeyRequestStruct local_118;
  GetIssuanceBlindingKeyRequest local_a0;
  
  GetIssuanceBlindingKeyRequest::GetIssuanceBlindingKeyRequest(&local_a0);
  core::JsonClassBase<cfd::js::api::json::GetIssuanceBlindingKeyRequest>::Deserialize
            (&local_a0.super_JsonClassBase<cfd::js::api::json::GetIssuanceBlindingKeyRequest>,
             (string *)this);
  GetIssuanceBlindingKeyRequest::ConvertToStruct(&local_118,&local_a0);
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(&local_298,request_message,&local_118);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_298.error.code == 0) {
      BlindingKeyResponse::BlindingKeyResponse((BlindingKeyResponse *)&local_1d0);
      BlindingKeyResponse::ConvertFromStruct((BlindingKeyResponse *)&local_1d0,&local_298);
      core::JsonClassBase<cfd::js::api::json::BlindingKeyResponse>::Serialize_abi_cxx11_
                (&local_2b8,(JsonClassBase<cfd::js::api::json::BlindingKeyResponse> *)&local_1d0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      BlindingKeyResponse::~BlindingKeyResponse((BlindingKeyResponse *)&local_1d0);
    }
    else {
      ErrorResponse::ConvertFromStruct(&local_1d0,&local_298.error);
      core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
                (&local_2b8,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&local_1d0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      local_1d0.super_ErrorResponseBase.super_JsonClassBase<cfd::js::api::json::ErrorResponseBase>.
      _vptr_JsonClassBase = (_func_int **)&PTR__ErrorResponseBase_00a85a68;
      InnerErrorResponse::~InnerErrorResponse(&local_1d0.super_ErrorResponseBase.error_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_1d0.super_ErrorResponseBase.ignore_items._M_t);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_298.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_298.error.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.error.message._M_dataplus._M_p != &local_298.error.message.field_2) {
      operator_delete(local_298.error.message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.error.type._M_dataplus._M_p != &local_298.error.type.field_2) {
      operator_delete(local_298.error.type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.blinding_key._M_dataplus._M_p != &local_298.blinding_key.field_2) {
      operator_delete(local_298.blinding_key._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_118.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.txid._M_dataplus._M_p != &local_118.txid.field_2) {
      operator_delete(local_118.txid._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.master_blinding_key._M_dataplus._M_p != &local_118.master_blinding_key.field_2)
    {
      operator_delete(local_118.master_blinding_key._M_dataplus._M_p);
    }
    GetIssuanceBlindingKeyRequest::~GetIssuanceBlindingKeyRequest(&local_a0);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_bad_function_call();
  BlindingKeyResponse::~BlindingKeyResponse((BlindingKeyResponse *)&local_1d0);
  pjVar1 = (json *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if (pjVar1 != this) {
    operator_delete(pjVar1);
  }
  BlindingKeyResponseStruct::~BlindingKeyResponseStruct(&local_298);
  GetIssuanceBlindingKeyRequestStruct::~GetIssuanceBlindingKeyRequestStruct(&local_118);
  GetIssuanceBlindingKeyRequest::~GetIssuanceBlindingKeyRequest(&local_a0);
  _Unwind_Resume(uVar2);
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}